

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

Vector3d * __thiscall OpenMD::Thermo::getSystemDipole(Vector3d *__return_storage_ptr__,Thermo *this)

{
  Snapshot *this_00;
  RealType RVar1;
  double dVar2;
  bool bVar3;
  Molecule *pMVar4;
  pointer ppAVar5;
  int __denom;
  Atom *this_01;
  int __numer;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  FluctuatingChargeAdapter fqa;
  Vector3d pPos;
  Vector3d nPos;
  MoleculeIterator miter;
  FixedChargeAdapter fca;
  Vector3d boxDipole;
  Vector3d dipoleVector;
  Vector3d ri;
  int local_14c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  FluctuatingChargeAdapter local_e8;
  Vector<double,_3U> local_e0;
  Vector<double,_3U> local_c8;
  MoleculeIterator local_b0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  Vector<double,_3U> *v;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasSystemDipole == false) {
    local_b0._M_node = (_Base_ptr)0x0;
    local_c8.data_[0] = 0.0;
    Vector<double,_3U>::Vector(&local_78,local_c8.data_);
    Vector<double,_3U>::Vector(&local_48,&local_78);
    local_e0.data_[0] = 0.0;
    Vector<double,_3U>::Vector(&local_c8,local_e0.data_);
    Vector<double,_3U>::Vector(&local_78,&local_c8);
    local_90.data_[0] = 0.0;
    Vector<double,_3U>::Vector(&local_e0,local_90.data_);
    Vector<double,_3U>::Vector(&local_c8,&local_e0);
    local_60.data_[0] = 0.0;
    Vector<double,_3U>::Vector(&local_90,local_60.data_);
    Vector<double,_3U>::Vector(&local_e0,&local_90);
    pMVar4 = SimInfo::beginMolecule(this->info_,&local_b0);
    iVar6 = 0;
    local_128 = ZEXT816(0);
    local_14c = 0;
    local_118 = ZEXT816(0);
    while (pMVar4 != (Molecule *)0x0) {
      ppAVar5 = (pMVar4->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppAVar5 !=
          (pMVar4->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) goto LAB_0015b2e9;
      this_01 = (Atom *)0x0;
      while (this_01 != (Atom *)0x0) {
        local_a8.data_[0] = (double)this_01->atomType_;
        bVar3 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)&local_a8);
        uVar7 = 0;
        uVar8 = 0;
        if (bVar3) {
          RVar1 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)&local_a8);
          uVar7 = SUB84(RVar1,0);
          uVar8 = (undefined4)((ulong)RVar1 >> 0x20);
        }
        dVar2 = (double)CONCAT44(uVar8,uVar7);
        local_e8.at_ = this_01->atomType_;
        bVar3 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_e8);
        if (bVar3) {
          dVar2 = dVar2 + *(double *)
                           (*(long *)((long)&(((this_01->super_StuntDouble).snapshotMan_)->
                                              currentSnapshot_->atomData).flucQPos.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start +
                                     (this_01->super_StuntDouble).storage_) +
                           (long)(this_01->super_StuntDouble).localIndex_ * 8);
        }
        dVar2 = dVar2 * 1.60217733e-19;
        StuntDouble::getPos((Vector3d *)&local_90,&this_01->super_StuntDouble);
        Vector<double,_3U>::operator=(&local_48,&local_90);
        Snapshot::wrapVector(this_00,(Vector3d *)&local_48);
        Vector<double,_3U>::mul(&local_48,1e-10);
        if (0.0 <= dVar2) {
          if (0.0 < dVar2) {
            Vector<double,_3U>::add(&local_e0,&local_48);
            uVar7 = local_128._12_4_;
            local_128._8_4_ = local_128._8_4_;
            local_128._0_8_ = local_128._0_8_ + dVar2;
            local_128._12_4_ = uVar7;
            local_14c = local_14c + 1;
          }
        }
        else {
          Vector<double,_3U>::add(&local_c8,&local_48);
          uVar7 = local_118._12_4_;
          local_118._8_4_ = local_118._8_4_;
          local_118._0_8_ = local_118._0_8_ - dVar2;
          local_118._12_4_ = uVar7;
          iVar6 = iVar6 + 1;
        }
        bVar3 = Atom::isDipole(this_01);
        if (bVar3) {
          StuntDouble::getDipole((Vector3d *)&local_60,&this_01->super_StuntDouble);
          operator*(&local_90,&local_60,3.33564095198e-30);
          Vector<double,_3U>::add(&local_78,&local_90);
        }
        ppAVar5 = ppAVar5 + 1;
        this_01 = (Atom *)0x0;
        if (ppAVar5 !=
            (pMVar4->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
LAB_0015b2e9:
          this_01 = *ppAVar5;
        }
      }
      pMVar4 = SimInfo::nextMolecule(this->info_,&local_b0);
    }
    v = &local_78;
    Vector<double,_3U>::Vector(&local_90,v);
    __numer = (int)v;
    if (0 < iVar6 && 0 < local_14c) {
      Vector<double,_3U>::div(&local_e0,__numer,local_14c);
      Vector<double,_3U>::div(&local_c8,__numer,__denom);
    }
    operator-(&local_a8,&local_e0,&local_c8);
    operator*(&local_60,&local_a8,
              (double)(~-(ulong)((double)local_118._0_8_ <= (double)local_128._0_8_) &
                       local_128._0_8_ |
                      local_118._0_8_ & -(ulong)((double)local_118._0_8_ <= (double)local_128._0_8_)
                      ));
    Vector<double,_3U>::add(&local_90,&local_60);
    Snapshot::setSystemDipole(this_00,(Vector3d *)&local_90);
  }
  Snapshot::getSystemDipole(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

Vector3d Thermo::getSystemDipole() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasSystemDipole) {
      SimInfo::MoleculeIterator miter;
      vector<Atom*>::iterator aiter;
      Molecule* mol;
      Atom* atom;
      RealType charge;
      Vector3d ri(0.0);
      Vector3d dipoleVector(0.0);
      Vector3d nPos(0.0);
      Vector3d pPos(0.0);
      RealType nChg(0.0);
      RealType pChg(0.0);
      int nCount = 0;
      int pCount = 0;

      RealType chargeToC   = 1.60217733e-19;
      RealType angstromToM = 1.0e-10;
      RealType debyeToCm   = 3.33564095198e-30;

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (atom = mol->beginAtom(aiter); atom != NULL;
             atom = mol->nextAtom(aiter)) {
          charge = 0.0;

          FixedChargeAdapter fca = FixedChargeAdapter(atom->getAtomType());
          if (fca.isFixedCharge()) { charge = fca.getCharge(); }

          FluctuatingChargeAdapter fqa =
              FluctuatingChargeAdapter(atom->getAtomType());
          if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(); }

          charge *= chargeToC;

          ri = atom->getPos();
          snap->wrapVector(ri);
          ri *= angstromToM;

          if (charge < 0.0) {
            nPos += ri;
            nChg -= charge;
            nCount++;
          } else if (charge > 0.0) {
            pPos += ri;
            pChg += charge;
            pCount++;
          }

          if (atom->isDipole()) {
            dipoleVector += atom->getDipole() * debyeToCm;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &pChg, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &nChg, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);

      MPI_Allreduce(MPI_IN_PLACE, &pCount, 1, MPI_INTEGER, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &nCount, 1, MPI_INTEGER, MPI_SUM,
                    MPI_COMM_WORLD);

      MPI_Allreduce(MPI_IN_PLACE, pPos.getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, nPos.getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);

      MPI_Allreduce(MPI_IN_PLACE, dipoleVector.getArrayPointer(), 3,
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif

      // first load the accumulated dipole moment (if dipoles were present)
      Vector3d boxDipole = dipoleVector;
      // now include the dipole moment due to charges
      // use the lesser of the positive and negative charge totals
      RealType chg_value = nChg <= pChg ? nChg : pChg;

      // find the average positions
      if (pCount > 0 && nCount > 0) {
        pPos /= pCount;
        nPos /= nCount;
      }

      // dipole is from the negative to the positive (physics notation)
      boxDipole += (pPos - nPos) * chg_value;
      snap->setSystemDipole(boxDipole);
    }

    return snap->getSystemDipole();
  }